

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover_cpu.cxx
# Opt level: O0

void __thiscall FlickerRemoverCPU::clear(FlickerRemoverCPU *this)

{
  BooleanArray2D *local_20;
  BooleanArray2D *to_delete_2;
  BooleanArray2D *to_delete_1;
  FlickerRemoverCPU *this_local;
  
  to_delete_2 = CircularBuffer<BooleanArray2D_*>::pop(&this->corresponding_frames_similarity_levels)
  ;
  while (to_delete_2 != (BooleanArray2D *)0x0) {
    if (to_delete_2 != (BooleanArray2D *)0x0) {
      BooleanArray2D::~BooleanArray2D(to_delete_2);
      operator_delete(to_delete_2,0x10);
    }
    to_delete_2 = CircularBuffer<BooleanArray2D_*>::pop
                            (&this->corresponding_frames_similarity_levels);
  }
  local_20 = CircularBuffer<BooleanArray2D_*>::pop(&this->adjacent_frames_similarity_levels);
  while (local_20 != (BooleanArray2D *)0x0) {
    if (local_20 != (BooleanArray2D *)0x0) {
      BooleanArray2D::~BooleanArray2D(local_20);
      operator_delete(local_20,0x10);
    }
    local_20 = CircularBuffer<BooleanArray2D_*>::pop(&this->adjacent_frames_similarity_levels);
  }
  return;
}

Assistant:

void FlickerRemoverCPU::clear()
{
    auto to_delete_1 = corresponding_frames_similarity_levels.pop();
    while(to_delete_1 != nullptr) {
        delete to_delete_1;
        to_delete_1 = corresponding_frames_similarity_levels.pop();
    }
    auto to_delete_2 = adjacent_frames_similarity_levels.pop();
    while(to_delete_2 != nullptr) {
        delete to_delete_2;
        to_delete_2 = adjacent_frames_similarity_levels.pop();
    }
}